

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

ANNdist __thiscall
ANNRectangle::DistPointRectangle(ANNRectangle *this,ANNcoord p1,ANNcoord p2,ANNcoord p3,ANNcoord p4)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  ANNdist *d;
  ANNdist dist;
  
  pdVar9 = (double *)operator_new__(0x20);
  if (*in_RDI <= in_XMM0_Qa) {
    if (in_RDI[1] <= in_XMM0_Qa) {
      *pdVar9 = in_RDI[1] - in_XMM0_Qa;
    }
    else {
      *pdVar9 = 0.0;
    }
  }
  else {
    *pdVar9 = *in_RDI - in_XMM0_Qa;
  }
  if (in_RDI[2] <= in_XMM1_Qa) {
    if (in_RDI[3] <= in_XMM1_Qa) {
      pdVar9[1] = in_RDI[3] - in_XMM1_Qa;
    }
    else {
      pdVar9[1] = 0.0;
    }
  }
  else {
    pdVar9[1] = in_RDI[2] - in_XMM1_Qa;
  }
  if (in_RDI[4] <= in_XMM2_Qa) {
    if (in_RDI[5] <= in_XMM2_Qa) {
      pdVar9[2] = in_RDI[5] - in_XMM2_Qa;
    }
    else {
      pdVar9[2] = 0.0;
    }
  }
  else {
    pdVar9[2] = in_RDI[4] - in_XMM2_Qa;
  }
  if (in_RDI[6] <= in_XMM3_Qa) {
    if (in_RDI[7] <= in_XMM3_Qa) {
      pdVar9[3] = in_RDI[7] - in_XMM3_Qa;
    }
    else {
      pdVar9[3] = 0.0;
    }
  }
  else {
    pdVar9[3] = in_RDI[6] - in_XMM3_Qa;
  }
  dVar1 = *pdVar9;
  dVar2 = *pdVar9;
  dVar3 = pdVar9[1];
  dVar4 = pdVar9[1];
  dVar5 = pdVar9[2];
  dVar6 = pdVar9[2];
  dVar7 = pdVar9[3];
  dVar8 = pdVar9[3];
  if (pdVar9 != (double *)0x0) {
    operator_delete__(pdVar9);
  }
  return dVar7 * dVar8 + dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4;
}

Assistant:

ANNdist ANNRectangle::DistPointRectangle(ANNcoord p1, ANNcoord p2, ANNcoord p3,
                                         ANNcoord p4) {
    ANNdist dist = 0.0;
    ANNdist *d = new ANNdist[4];

    if (p1 < bnds1[LO])
        d[0] = bnds1[LO] - p1;
    else if (p1 < bnds1[HI])
        d[0] = 0.0;
    else
        d[0] = bnds1[HI] - p1;

    if (p2 < bnds2[LO])
        d[1] = bnds2[LO] - p2;
    else if (p2 < bnds2[HI])
        d[1] = 0.0;
    else
        d[1] = bnds2[HI] - p2;

    if (p3 < bnds3[LO])
        d[2] = bnds3[LO] - p3;
    else if (p3 < bnds3[HI])
        d[2] = 0.0;
    else
        d[2] = bnds3[HI] - p3;

    if (p4 < bnds4[LO])
        d[3] = bnds4[LO] - p4;
    else if (p4 < bnds4[HI])
        d[3] = 0.0;
    else
        d[3] = bnds4[HI] - p4;

    dist = ANN_POW(d[0]) + ANN_POW(d[1]) + ANN_POW(d[2]) + ANN_POW(d[3]);
    delete[] d;
    return dist;
}